

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propname.cpp
# Opt level: O0

int32_t uprv_compareASCIIPropertyNames_63(char *name1,char *name2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int32_t r2;
  int32_t r1;
  int32_t rc;
  char *name2_local;
  char *name1_local;
  
  _r1 = name2;
  name2_local = name1;
  while( true ) {
    uVar1 = getASCIIPropertyNameChar(name2_local);
    uVar2 = getASCIIPropertyNameChar(_r1);
    if (((uVar1 | uVar2) & 0xff) == 0) {
      return 0;
    }
    if ((uVar1 != uVar2) && (iVar3 = (uVar1 & 0xff) - (uVar2 & 0xff), iVar3 != 0)) break;
    name2_local = name2_local + ((int)uVar1 >> 8);
    _r1 = _r1 + ((int)uVar2 >> 8);
  }
  return iVar3;
}

Assistant:

U_CAPI int32_t U_EXPORT2
uprv_compareASCIIPropertyNames(const char *name1, const char *name2) {
    int32_t rc, r1, r2;

    for(;;) {
        r1=getASCIIPropertyNameChar(name1);
        r2=getASCIIPropertyNameChar(name2);

        /* If we reach the ends of both strings then they match */
        if(((r1|r2)&0xff)==0) {
            return 0;
        }

        /* Compare the lowercased characters */
        if(r1!=r2) {
            rc=(r1&0xff)-(r2&0xff);
            if(rc!=0) {
                return rc;
            }
        }

        name1+=r1>>8;
        name2+=r2>>8;
    }
}